

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qvariant.cpp
# Opt level: O2

qulonglong __thiscall QVariant::toULongLong(QVariant *this,bool *ok)

{
  unsigned_long_long uVar1;
  
  uVar1 = qNumVariantToHelper<unsigned_long_long>(&this->d,ok);
  return uVar1;
}

Assistant:

qulonglong QVariant::toULongLong(bool *ok) const
{
    return qNumVariantToHelper<qulonglong>(d, ok);
}